

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O0

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* anon_unknown.dwarf_7f68::split_hostname
            (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *address)

{
  size_t __args;
  char *pcVar1;
  bool local_c2;
  bool local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [39];
  bool local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [8];
  string host;
  size_t port_off;
  string local_50 [37];
  bool local_2b;
  bool local_2a;
  byte local_29;
  bool can_be_ipv6;
  size_t sStack_28;
  bool multiple_semicolons;
  size_t last_of;
  size_t first_of;
  string *address_local;
  
  first_of = (size_t)address;
  address_local = (string *)__return_storage_ptr__;
  last_of = std::__cxx11::string::find_first_of((char)address,0x3a);
  sStack_28 = std::__cxx11::string::find_last_of((char)first_of,0x3a);
  local_29 = last_of != sStack_28;
  if ((bool)local_29) {
    pcVar1 = (char *)std::__cxx11::string::operator[](first_of);
    local_c2 = false;
    if (*pcVar1 == '[') {
      pcVar1 = (char *)std::__cxx11::string::operator[](first_of);
      local_c2 = *pcVar1 == ']';
    }
    local_c1 = local_c2;
  }
  else {
    local_c1 = false;
  }
  __args = first_of;
  local_2a = local_c1;
  if ((sStack_28 == 0xffffffffffffffff) || (((local_29 & 1) != 0 && (local_c1 == false)))) {
    local_2b = false;
    std::__cxx11::string::string(local_50);
    std::make_tuple<std::__cxx11::string_const&,bool,std::__cxx11::string>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args,&local_2b
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::__cxx11::string::~string(local_50);
  }
  else {
    if (((local_29 & 1) == 0) || (local_c1 == false)) {
      std::__cxx11::string::substr((ulong)local_88,first_of);
    }
    else {
      std::__cxx11::string::substr((ulong)local_88,first_of);
    }
    local_89 = true;
    std::__cxx11::string::substr((ulong)local_b0,first_of);
    std::make_tuple<std::__cxx11::string,bool,std::__cxx11::string>
              (__return_storage_ptr__,local_88,&local_89,local_b0);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<std::string, bool, std::string> split_hostname(const std::string& address)
	{
		size_t first_of = address.find_first_of(':');
		size_t last_of = address.find_last_of(':');

		const bool multiple_semicolons = first_of != last_of;
		const bool can_be_ipv6 = !multiple_semicolons ? false :
			address[0] == '[' && address[last_of - 1] == ']';
		if (last_of == std::string::npos || (multiple_semicolons && !can_be_ipv6))
			return std::make_tuple(address, false, std::string());
		else
		{
			const size_t port_off = last_of + sizeof(':');
			std::string host = (multiple_semicolons && can_be_ipv6)
				? address.substr(1, last_of - 2)
				: address.substr(0, last_of);
			return std::make_tuple(std::move(host), true, address.substr(port_off));
		}
	}